

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_AEAD.c
# Opt level: O2

EverCrypt_Error_error_code
EverCrypt_AEAD_decrypt
          (EverCrypt_AEAD_state_s *s,uint8_t *iv,uint32_t iv_len,uint8_t *ad,uint32_t ad_len,
          uint8_t *cipher,uint32_t cipher_len,uint8_t *tag,uint8_t *dst)

{
  Spec_Cipher_Expansion_impl SVar1;
  uint8_t *puVar2;
  EverCrypt_Error_error_code EVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint64_t len128x6_;
  uint8_t *__dest;
  uint8_t *puVar9;
  uint8_t *puVar10;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  if (s == (EverCrypt_AEAD_state_s *)0x0) {
    return '\x02';
  }
  SVar1 = s->impl;
  if (SVar1 == '\0') {
    EVar3 = decrypt_chacha20_poly1305(s,iv,iv_len,ad,ad_len,cipher,cipher_len,tag,dst);
    return EVar3;
  }
  if (SVar1 == '\x02') {
    if (iv_len == 0) {
      return '\x04';
    }
    puVar2 = s->ek;
    __dest = puVar2 + 0x170;
    local_48 = 0;
    uStack_40 = 0;
    memcpy(&local_48,iv + (iv_len & 0xfffffff0),(ulong)(iv_len & 0xf));
    compute_iv_stdcall(iv,iv_len,iv_len >> 4,&local_48,&local_48,puVar2 + 0xf0);
    uVar4 = (ulong)(cipher_len & 0xfffffff0);
    local_38 = (ulong)(cipher_len & 0xf);
    memcpy(__dest,cipher + uVar4,local_38);
    memcpy(puVar2 + 0x180,ad + (ad_len & 0xfffffff0),(ulong)(ad_len & 0xf));
    uVar8 = cipher_len - cipher_len % 0x60;
    if (uVar8 < 0x60) {
      uVar7 = (ulong)(cipher_len >> 4);
      uVar8 = 0;
      puVar9 = cipher;
      puVar10 = dst;
    }
    else {
      uVar5 = (ulong)uVar8;
      uVar8 = uVar8 >> 4;
      uVar7 = (cipher_len & 0xfffffff0) - uVar5 >> 4;
      puVar9 = cipher + uVar5;
      puVar10 = dst + uVar5;
    }
    lVar6 = gcm256_decrypt_opt(ad,ad_len,ad_len >> 4,puVar2,&local_48,puVar2 + 0xf0,puVar2 + 0x180,
                               cipher,dst,uVar8,puVar9,puVar10,uVar7,__dest,cipher_len,puVar2 + 400,
                               tag);
  }
  else {
    if (SVar1 != '\x01') {
      fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_AEAD.c"
              ,0x5f4);
      exit(0xfd);
    }
    if (iv_len == 0) {
      return '\x04';
    }
    puVar2 = s->ek;
    __dest = puVar2 + 0x130;
    local_48 = 0;
    uStack_40 = 0;
    memcpy(&local_48,iv + (iv_len & 0xfffffff0),(ulong)(iv_len & 0xf));
    compute_iv_stdcall(iv,iv_len,iv_len >> 4,&local_48,&local_48,puVar2 + 0xb0);
    uVar4 = (ulong)(cipher_len & 0xfffffff0);
    local_38 = (ulong)(cipher_len & 0xf);
    memcpy(__dest,cipher + uVar4,local_38);
    memcpy(puVar2 + 0x140,ad + (ad_len & 0xfffffff0),(ulong)(ad_len & 0xf));
    uVar8 = cipher_len - cipher_len % 0x60;
    if (uVar8 < 0x60) {
      uVar7 = (ulong)(cipher_len >> 4);
      uVar8 = 0;
      puVar9 = cipher;
      puVar10 = dst;
    }
    else {
      uVar5 = (ulong)uVar8;
      uVar8 = uVar8 >> 4;
      uVar7 = (cipher_len & 0xfffffff0) - uVar5 >> 4;
      puVar9 = cipher + uVar5;
      puVar10 = dst + uVar5;
    }
    lVar6 = gcm128_decrypt_opt(ad,ad_len,ad_len >> 4,puVar2,&local_48,puVar2 + 0xb0,puVar2 + 0x140,
                               cipher,dst,uVar8,puVar9,puVar10,uVar7,__dest,cipher_len,
                               puVar2 + 0x150,tag);
  }
  memcpy(dst + uVar4,__dest,local_38);
  return (lVar6 != 0) * '\x03';
}

Assistant:

EverCrypt_Error_error_code
EverCrypt_AEAD_decrypt(
  EverCrypt_AEAD_state_s *s,
  uint8_t *iv,
  uint32_t iv_len,
  uint8_t *ad,
  uint32_t ad_len,
  uint8_t *cipher,
  uint32_t cipher_len,
  uint8_t *tag,
  uint8_t *dst
)
{
  if (s == NULL)
  {
    return EverCrypt_Error_InvalidKey;
  }
  Spec_Cipher_Expansion_impl i = (*s).impl;
  switch (i)
  {
    case Spec_Cipher_Expansion_Vale_AES128:
      {
        return decrypt_aes128_gcm(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    case Spec_Cipher_Expansion_Vale_AES256:
      {
        return decrypt_aes256_gcm(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    case Spec_Cipher_Expansion_Hacl_CHACHA20:
      {
        return decrypt_chacha20_poly1305(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}